

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexerHelper.cxx
# Opt level: O2

void __thiscall cmGccDepfileLexerHelper::newDependency(cmGccDepfileLexerHelper *this)

{
  pointer pcVar1;
  pointer pbVar2;
  
  if (this->HelperState != Failed) {
    this->HelperState = Dependency;
    pcVar1 = (this->Content).
             super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pbVar2 = pcVar1[-1].paths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pcVar1[-1].paths.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start == pbVar2) || (pbVar2[-1]._M_string_length != 0))
    {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&pcVar1[-1].paths);
      return;
    }
  }
  return;
}

Assistant:

void cmGccDepfileLexerHelper::newDependency()
{
  if (this->HelperState == State::Failed) {
    return;
  }
  this->HelperState = State::Dependency;
  auto& entry = this->Content.back();
  if (entry.paths.empty() || !entry.paths.back().empty()) {
    entry.paths.emplace_back();
  }
}